

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeRecordCompareInt(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (9 < *(byte *)((long)pKey1 + 1)) {
switchD_00137756_caseD_0:
    iVar4 = vdbeRecordCompareWithSkip(nKey1,pKey1,pPKey2,0);
    return iVar4;
  }
  uVar5 = (ulong)(*pKey1 & 0x3f);
  lVar3 = (pPKey2->aMem->u).i;
  switch(*(byte *)((long)pKey1 + 1)) {
  default:
    goto switchD_00137756_caseD_0;
  case 1:
    uVar6 = (ulong)*(char *)((long)pKey1 + uVar5);
    break;
  case 2:
    uVar7 = (long)*(char *)((long)pKey1 + uVar5) << 8;
    uVar6 = (ulong)*(byte *)((long)pKey1 + uVar5 + 1);
    goto LAB_001377f1;
  case 3:
    uVar6 = (ulong)*(byte *)((long)pKey1 + uVar5 + 1) << 8 |
            (long)*(char *)((long)pKey1 + uVar5) << 0x10;
    bVar1 = *(byte *)((long)pKey1 + uVar5 + 2);
    goto LAB_001377cf;
  case 4:
    uVar6 = (ulong)*(byte *)((long)pKey1 + uVar5 + 2) << 8 |
            (long)(int)((uint)*(byte *)((long)pKey1 + uVar5) << 0x18) |
            (ulong)*(byte *)((long)pKey1 + uVar5 + 1) << 0x10;
    bVar1 = *(byte *)((long)pKey1 + uVar5 + 3);
LAB_001377cf:
    uVar6 = bVar1 | uVar6;
    break;
  case 5:
    uVar2 = *(uint *)((long)pKey1 + uVar5 + 2);
    uVar7 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
    ;
    uVar6 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar5),
                                       *(undefined1 *)((long)pKey1 + uVar5 + 1)) << 0x20;
LAB_001377f1:
    uVar6 = uVar6 | uVar7;
    break;
  case 6:
    uVar5 = *(ulong *)((long)pKey1 + uVar5);
    uVar6 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    break;
  case 8:
    uVar6 = 0;
    break;
  case 9:
    uVar6 = 1;
  }
  if ((long)uVar6 < lVar3) {
    return pPKey2->r1;
  }
  if (lVar3 < (long)uVar6) {
    return pPKey2->r2;
  }
  if (1 < pPKey2->nField) {
    iVar4 = vdbeRecordCompareWithSkip(nKey1,pKey1,pPKey2,1);
    return iVar4;
  }
  return (int)pPKey2->default_rc;
}

Assistant:

static int vdbeRecordCompareInt(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey = &((const u8*)pKey1)[*(const u8*)pKey1 & 0x3F];
  int serial_type = ((const u8*)pKey1)[1];
  int res;
  u32 y;
  u64 x;
  i64 v = pPKey2->aMem[0].u.i;
  i64 lhs;

  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  assert( (*(u8*)pKey1)<=0x3F || CORRUPT_DB );
  switch( serial_type ){
    case 1: { /* 1-byte signed integer */
      lhs = ONE_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 2: { /* 2-byte signed integer */
      lhs = TWO_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 3: { /* 3-byte signed integer */
      lhs = THREE_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 4: { /* 4-byte signed integer */
      y = FOUR_BYTE_UINT(aKey);
      lhs = (i64)*(int*)&y;
      testcase( lhs<0 );
      break;
    }
    case 5: { /* 6-byte signed integer */
      lhs = FOUR_BYTE_UINT(aKey+2) + (((i64)1)<<32)*TWO_BYTE_INT(aKey);
      testcase( lhs<0 );
      break;
    }
    case 6: { /* 8-byte signed integer */
      x = FOUR_BYTE_UINT(aKey);
      x = (x<<32) | FOUR_BYTE_UINT(aKey+4);
      lhs = *(i64*)&x;
      testcase( lhs<0 );
      break;
    }
    case 8: 
      lhs = 0;
      break;
    case 9:
      lhs = 1;
      break;

    /* This case could be removed without changing the results of running
    ** this code. Including it causes gcc to generate a faster switch 
    ** statement (since the range of switch targets now starts at zero and
    ** is contiguous) but does not cause any duplicate code to be generated
    ** (as gcc is clever enough to combine the two like cases). Other 
    ** compilers might be similar.  */ 
    case 0: case 7:
      return sqlite3VdbeRecordCompare(nKey1, pKey1, pPKey2);

    default:
      return sqlite3VdbeRecordCompare(nKey1, pKey1, pPKey2);
  }

  if( v>lhs ){
    res = pPKey2->r1;
  }else if( v<lhs ){
    res = pPKey2->r2;
  }else if( pPKey2->nField>1 ){
    /* The first fields of the two keys are equal. Compare the trailing 
    ** fields.  */
    res = vdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
  }else{
    /* The first fields of the two keys are equal and there are no trailing
    ** fields. Return pPKey2->default_rc in this case. */
    res = pPKey2->default_rc;
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res) );
  return res;
}